

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * debug_varname(GCproto *pt,BCPos pc,BCReg slot)

{
  uint uVar1;
  uint32_t uVar2;
  GCproto *pGVar3;
  bool bVar4;
  BCPos endpc;
  BCPos startpc;
  uint32_t vn;
  char *name;
  GCproto *pGStack_28;
  BCPos lastpc;
  char *p;
  BCReg slot_local;
  BCPos pc_local;
  GCproto *pt_local;
  
  pGStack_28 = (GCproto *)(pt->varinfo).ptr64;
  if (pGStack_28 == (GCproto *)0x0) {
LAB_0010e143:
    pt_local = (GCproto *)0x0;
  }
  else {
    name._4_4_ = 0;
    p._0_4_ = slot;
    p._4_4_ = pc;
    _slot_local = pt;
    do {
      _startpc = (char *)pGStack_28;
      uVar1 = (uint)(byte)(pGStack_28->nextgc).gcptr64;
      if (uVar1 < 7) {
        if (uVar1 == 0) goto LAB_0010e143;
      }
      else {
        do {
          pGStack_28 = (GCproto *)((long)&(pGStack_28->nextgc).gcptr64 + 1);
        } while ((char)(pGStack_28->nextgc).gcptr64 != '\0');
      }
      pGStack_28 = (GCproto *)((long)&(pGStack_28->nextgc).gcptr64 + 1);
      uVar2 = lj_buf_ruleb128((char **)&stack0xffffffffffffffd8);
      name._4_4_ = name._4_4_ + uVar2;
      if (p._4_4_ < name._4_4_) goto LAB_0010e143;
      uVar2 = lj_buf_ruleb128((char **)&stack0xffffffffffffffd8);
    } while ((name._4_4_ + uVar2 <= p._4_4_) ||
            (bVar4 = (BCReg)p != 0, p._0_4_ = (BCReg)p - 1, bVar4));
    if (uVar1 < 7) {
      _startpc = "(for index)";
      endpc = uVar1 - 1;
      if (endpc != 0) {
        do {
          pGVar3 = (GCproto *)((long)&(((GCproto *)_startpc)->nextgc).gcptr64 + 1);
          bVar4 = true;
          if ((char)(((GCproto *)_startpc)->nextgc).gcptr64 == '\0') {
            endpc = endpc - 1;
            bVar4 = endpc != 0;
          }
          _startpc = (char *)pGVar3;
        } while (bVar4);
      }
    }
    pt_local = (GCproto *)_startpc;
  }
  return (char *)pt_local;
}

Assistant:

static const char *debug_varname(const GCproto *pt, BCPos pc, BCReg slot)
{
  const char *p = (const char *)proto_varinfo(pt);
  if (p) {
    BCPos lastpc = 0;
    for (;;) {
      const char *name = p;
      uint32_t vn = *(const uint8_t *)p;
      BCPos startpc, endpc;
      if (vn < VARNAME__MAX) {
	if (vn == VARNAME_END) break;  /* End of varinfo. */
      } else {
	do { p++; } while (*(const uint8_t *)p);  /* Skip over variable name. */
      }
      p++;
      lastpc = startpc = lastpc + lj_buf_ruleb128(&p);
      if (startpc > pc) break;
      endpc = startpc + lj_buf_ruleb128(&p);
      if (pc < endpc && slot-- == 0) {
	if (vn < VARNAME__MAX) {
#define VARNAMESTR(name, str)	str "\0"
	  name = VARNAMEDEF(VARNAMESTR);
#undef VARNAMESTR
	  if (--vn) while (*name++ || --vn) ;
	}
	return name;
      }
    }
  }
  return NULL;
}